

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_handle.c
# Opt level: O2

uint32_t skynet_handle_register(skynet_context *ctx)

{
  handle_storage *phVar1;
  uint uVar2;
  uint32_t uVar3;
  skynet_context **ppsVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  char *__assertion;
  int iVar9;
  
  phVar1 = H;
  rwlock_wlock(&H->lock);
  iVar9 = phVar1->slot_size;
  while( true ) {
    iVar5 = 0;
    if (0 < iVar9) {
      iVar5 = iVar9;
    }
    iVar7 = 0;
    while (iVar5 != iVar7) {
      uVar2 = phVar1->handle_index + iVar7 & 0xffffff;
      uVar8 = uVar2 & iVar9 - 1U;
      iVar7 = iVar7 + 1;
      if (phVar1->slot[uVar8] == (skynet_context *)0x0) {
        phVar1->slot[uVar8] = ctx;
        phVar1->handle_index = uVar2 + 1;
        (phVar1->lock).write = 0;
        return uVar2 | phVar1->harbor;
      }
    }
    if (0x800000 < iVar9) break;
    ppsVar4 = (skynet_context **)calloc(1,(long)(iVar9 * 2) << 3);
    for (lVar6 = 0; lVar6 < iVar9; lVar6 = lVar6 + 1) {
      uVar3 = skynet_context_handle(phVar1->slot[lVar6]);
      iVar9 = phVar1->slot_size;
      uVar2 = iVar9 * 2 - 1U & uVar3;
      if (ppsVar4[(int)uVar2] != (skynet_context *)0x0) {
        __assertion = "new_slot[hash] == NULL";
        uVar2 = 0x3c;
        goto LAB_00112684;
      }
      ppsVar4[(int)uVar2] = phVar1->slot[lVar6];
    }
    free(phVar1->slot);
    phVar1->slot = ppsVar4;
    iVar9 = phVar1->slot_size * 2;
    phVar1->slot_size = iVar9;
  }
  __assertion = "(s->slot_size*2 - 1) <= HANDLE_MASK";
  uVar2 = 0x37;
LAB_00112684:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_handle.c"
                ,uVar2,"uint32_t skynet_handle_register(struct skynet_context *)");
}

Assistant:

uint32_t
skynet_handle_register(struct skynet_context *ctx) {
	struct handle_storage *s = H;

	rwlock_wlock(&s->lock);
	
	for (;;) {
		int i;
		for (i=0;i<s->slot_size;i++) {
			uint32_t handle = (i+s->handle_index) & HANDLE_MASK;
			int hash = handle & (s->slot_size-1);
			if (s->slot[hash] == NULL) {
				s->slot[hash] = ctx;
				s->handle_index = handle + 1;

				rwlock_wunlock(&s->lock);

				handle |= s->harbor;
				return handle;
			}
		}
		assert((s->slot_size*2 - 1) <= HANDLE_MASK);
		struct skynet_context ** new_slot = skynet_malloc(s->slot_size * 2 * sizeof(struct skynet_context *));
		memset(new_slot, 0, s->slot_size * 2 * sizeof(struct skynet_context *));
		for (i=0;i<s->slot_size;i++) {
			int hash = skynet_context_handle(s->slot[i]) & (s->slot_size * 2 - 1);
			assert(new_slot[hash] == NULL);
			new_slot[hash] = s->slot[i];
		}
		skynet_free(s->slot);
		s->slot = new_slot;
		s->slot_size *= 2;
	}
}